

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_compute_eflags(DisasContext *s)

{
  TCGContext *tcg_ctx_00;
  byte bVar1;
  int dead;
  int live;
  TCGv_i64 src2;
  TCGv_i64 src1;
  TCGv_i64 dst;
  TCGv_i64 zero;
  TCGContext *tcg_ctx;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->cc_op != CC_OP_EFLAGS) {
    if (s->cc_op == CC_OP_CLR) {
      tcg_gen_movi_i64_x86_64(tcg_ctx_00,tcg_ctx_00->cpu_cc_src,0x44);
      set_cc_op(s,CC_OP_EFLAGS);
    }
    else {
      dst = (TCGv_i64)0x0;
      src1 = tcg_ctx_00->cpu_cc_dst;
      src2 = tcg_ctx_00->cpu_cc_src;
      _dead = tcg_ctx_00->cpu_cc_src2;
      bVar1 = "\a\x02\x03\x03\x03\x03\x03\x03\x03\x03\a\a\a\a\v\v\v\v\a\a\a\a\x01\x01\x01\x01\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x06\a"
              [s->cc_op] & 0xf7 ^ 7;
      if (bVar1 != 0) {
        dst = tcg_const_i64_x86_64(tcg_ctx_00,0);
        if ((bVar1 & 1) != 0) {
          src1 = dst;
        }
        if ((bVar1 & 2) != 0) {
          src2 = dst;
        }
        if ((bVar1 & 4) != 0) {
          _dead = dst;
        }
      }
      gen_update_cc_op(s);
      gen_helper_cc_compute_all
                (tcg_ctx_00,tcg_ctx_00->cpu_cc_src,src1,src2,_dead,tcg_ctx_00->cpu_cc_op);
      set_cc_op(s,CC_OP_EFLAGS);
      if (bVar1 != 0) {
        tcg_temp_free_i64(tcg_ctx_00,dst);
      }
    }
  }
  return;
}

Assistant:

static void gen_compute_eflags(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv zero, dst, src1, src2;
    int live, dead;

    if (s->cc_op == CC_OP_EFLAGS) {
        return;
    }
    if (s->cc_op == CC_OP_CLR) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_cc_src, CC_Z | CC_P);
        set_cc_op(s, CC_OP_EFLAGS);
        return;
    }

    zero = NULL;
    dst = tcg_ctx->cpu_cc_dst;
    src1 = tcg_ctx->cpu_cc_src;
    src2 = tcg_ctx->cpu_cc_src2;

    /* Take care to not read values that are not live.  */
    live = cc_op_live[s->cc_op] & ~USES_CC_SRCT;
    dead = live ^ (USES_CC_DST | USES_CC_SRC | USES_CC_SRC2);
    if (dead) {
        zero = tcg_const_tl(tcg_ctx, 0);
        if (dead & USES_CC_DST) {
            dst = zero;
        }
        if (dead & USES_CC_SRC) {
            src1 = zero;
        }
        if (dead & USES_CC_SRC2) {
            src2 = zero;
        }
    }

    gen_update_cc_op(s);
    gen_helper_cc_compute_all(tcg_ctx, tcg_ctx->cpu_cc_src, dst, src1, src2, tcg_ctx->cpu_cc_op);
    set_cc_op(s, CC_OP_EFLAGS);

    if (dead) {
        tcg_temp_free(tcg_ctx, zero);
    }
}